

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void mbedtls_strerror(int ret,char *buf,size_t buflen)

{
  char *pcVar1;
  size_t sVar2;
  uint uVar3;
  uint error_code;
  
  if (buflen != 0) {
    memset(buf,0,buflen);
    error_code = -ret;
    if (0 < ret) {
      error_code = ret;
    }
    uVar3 = error_code & 0xff80;
    if (uVar3 != 0) {
      pcVar1 = mbedtls_high_level_strerr(error_code);
      if (pcVar1 == (char *)0x0) {
        snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar3);
      }
      else {
        snprintf(buf,buflen,"%s",pcVar1);
      }
      if (uVar3 == 0x7780) {
        return;
      }
    }
    if ((error_code & 0x7fff007f) != 0) {
      sVar2 = strlen(buf);
      if (sVar2 != 0) {
        if (buflen - sVar2 < 5) {
          return;
        }
        snprintf(buf + sVar2,buflen - sVar2," : ");
        buf = buf + sVar2 + 3;
        buflen = buflen - (sVar2 + 3);
      }
      pcVar1 = mbedtls_low_level_strerr(error_code);
      if (pcVar1 == (char *)0x0) {
        snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)(error_code & 0x7fff007f));
        return;
      }
      snprintf(buf,buflen,"%s",pcVar1);
      return;
    }
  }
  return;
}

Assistant:

void mbedtls_strerror(int ret, char *buf, size_t buflen)
{
    size_t len;
    int use_ret;
    const char *high_level_error_description = NULL;
    const char *low_level_error_description = NULL;

    if (buflen == 0) {
        return;
    }

    memset(buf, 0x00, buflen);

    if (ret < 0) {
        ret = -ret;
    }

    if (ret & 0xFF80) {
        use_ret = ret & 0xFF80;

        // Translate high level error code.
        high_level_error_description = mbedtls_high_level_strerr(ret);

        if (high_level_error_description == NULL) {
            mbedtls_snprintf(buf, buflen, "UNKNOWN ERROR CODE (%04X)", (unsigned int) use_ret);
        } else {
            mbedtls_snprintf(buf, buflen, "%s", high_level_error_description);
        }

#if defined(MBEDTLS_SSL_TLS_C)
        // Early return in case of a fatal error - do not try to translate low
        // level code.
        if (use_ret == -(MBEDTLS_ERR_SSL_FATAL_ALERT_MESSAGE)) {
            return;
        }
#endif /* MBEDTLS_SSL_TLS_C */
    }

    use_ret = ret & ~0xFF80;

    if (use_ret == 0) {
        return;
    }

    // If high level code is present, make a concatenation between both
    // error strings.
    //
    len = strlen(buf);

    if (len > 0) {
        if (buflen - len < 5) {
            return;
        }

        mbedtls_snprintf(buf + len, buflen - len, " : ");

        buf += len + 3;
        buflen -= len + 3;
    }

    // Translate low level error code.
    low_level_error_description = mbedtls_low_level_strerr(ret);

    if (low_level_error_description == NULL) {
        mbedtls_snprintf(buf, buflen, "UNKNOWN ERROR CODE (%04X)", (unsigned int) use_ret);
    } else {
        mbedtls_snprintf(buf, buflen, "%s", low_level_error_description);
    }
}